

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  byte in_SIL;
  float unaff_retaddr;
  ImDrawCornerFlags unaff_retaddr_00;
  float in_stack_00000008;
  ImU32 in_stack_0000000c;
  ImVec2 *in_stack_00000010;
  ImVec2 *in_stack_00000018;
  ImDrawList *in_stack_00000020;
  float border_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff88;
  ImU32 in_stack_ffffffffffffff8c;
  float _x;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 *this;
  ImVec2 *in_stack_ffffffffffffff98;
  ImDrawList *in_stack_ffffffffffffffa0;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  float local_34;
  ImGuiWindow *local_30;
  ImGuiContext *local_28;
  byte local_15;
  
  local_15 = in_SIL & 1;
  local_28 = GImGui;
  local_30 = GImGui->CurrentWindow;
  ImDrawList::AddRectFilled
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  local_34 = (local_28->Style).FrameBorderSize;
  if (((local_15 & 1) != 0) && (0.0 < local_34)) {
    _x = 1.0;
    ImVec2::ImVec2(&local_44,1.0,1.0);
    local_3c = ::operator+(in_stack_ffffffffffffff78,(ImVec2 *)0x2f2547);
    this = &local_54;
    ImVec2::ImVec2(this,_x,_x);
    local_4c = ::operator+(in_stack_ffffffffffffff78,(ImVec2 *)0x2f2574);
    GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
    ImDrawList::AddRect(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                        in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
    ImDrawList::AddRect(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                        in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}